

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.h
# Opt level: O2

Value * __thiscall flow::Runner::Stack::operator[](Stack *this,int relativeIndex)

{
  pointer puVar1;
  FILE *__stream;
  Value *pVVar2;
  long lVar3;
  allocator<char> local_31;
  undefined8 local_30 [4];
  
  __stream = _stderr;
  if (relativeIndex < 0) {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if ((ulong)(lVar3 >> 3) <= (ulong)(uint)~relativeIndex) goto LAB_001564e0;
    pVVar2 = (Value *)((long)puVar1 + (long)relativeIndex * 8 + lVar3);
  }
  else {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stack_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)(uint)relativeIndex) {
LAB_001564e0:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_30,"vm: Attempt to load from stack beyond stack top",&local_31);
      fprintf(__stream,"%s\n",local_30[0]);
      std::__cxx11::string::~string((string *)local_30);
      abort();
    }
    pVVar2 = puVar1 + (uint)relativeIndex;
  }
  return pVVar2;
}

Assistant:

Value& operator[](int relativeIndex) {
      if (relativeIndex < 0) {
        FLOW_ASSERT(static_cast<size_t>(-relativeIndex - 1) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[stack_.size() + relativeIndex];
      } else {
        FLOW_ASSERT(static_cast<size_t>(relativeIndex) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[relativeIndex];
      }
    }